

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

ON_wString __thiscall ON_XMLNode::GetPathFromRoot(ON_XMLNode *this)

{
  long lVar1;
  int iVar2;
  ON_wString *pOVar3;
  long *plVar4;
  long *plVar5;
  wchar_t *wsz;
  long *in_RSI;
  
  lVar1 = in_RSI[1];
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(lVar1 + 0x40));
  if (iVar2 == 0) {
    pOVar3 = (ON_wString *)(**(code **)(*in_RSI + 0x18))();
    ON_wString::ON_wString((ON_wString *)this,pOVar3);
    plVar4 = (long *)(**(code **)(*in_RSI + 0x40))();
    if (plVar4 != (long *)0x0) {
      while( true ) {
        plVar5 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
        if (plVar5 == (long *)0x0) break;
        ON_wString::Insert((ON_wString *)this,0,L'/',1);
        pOVar3 = (ON_wString *)(**(code **)(*plVar4 + 0x18))(plVar4);
        wsz = ON_wString::operator_cast_to_wchar_t_(pOVar3);
        ON_wString::Insert((ON_wString *)this,0,wsz);
        plVar4 = plVar5;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0x40));
    return (ON_wString)(wchar_t *)this;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ON_wString ON_XMLNode::GetPathFromRoot(void) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  ON_wString sPath = TagName();
  PrependNodeToStringAndRecurseParents(Parent(), sPath);

  return sPath;
}